

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O3

bool __thiscall Minisat::OnlineProofChecker::propagate(OnlineProofChecker *this)

{
  ulong *puVar1;
  byte bVar2;
  uint *puVar3;
  lbool *plVar4;
  Watcher WVar5;
  Watcher WVar6;
  int iVar7;
  uint uVar8;
  ostream *poVar9;
  uint uVar10;
  Watcher *pWVar11;
  byte bVar12;
  long lVar13;
  ulong uVar14;
  vec<Minisat::Watcher> *pvVar15;
  uint uVar16;
  uint uVar17;
  Watcher *pWVar18;
  Watcher *pWVar19;
  Lit LVar20;
  uint uVar21;
  bool bVar22;
  uint local_5c;
  Watcher local_48;
  Watcher *local_40;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *local_38;
  
  local_38 = &this->watches;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::cleanAll
            (local_38);
  if (3 < this->verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"c [DRAT-OTFC] propagate ... ",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    if (4 < this->verbose) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"c [DRAT-OTFC] propagate ",0x18);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(this->unitClauses).sz);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," units",6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
    }
  }
  iVar7 = (this->unitClauses).sz;
  if (0 < iVar7) {
    lVar13 = 0;
    do {
      LVar20.x = (this->unitClauses).data[lVar13].x;
      bVar2 = (this->assigns).data[LVar20.x >> 1].value;
      bVar12 = (byte)LVar20.x & 1;
      if (bVar2 != bVar12) {
        if ((bVar2 ^ bVar12) == 1) {
          return true;
        }
        uncheckedEnqueue(this,LVar20);
        iVar7 = (this->unitClauses).sz;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < iVar7);
  }
  iVar7 = this->qhead;
  if (iVar7 < (this->trail).sz) {
    local_5c = 0xffffffff;
    do {
      this->qhead = iVar7 + 1;
      uVar8 = (this->trail).data[iVar7].x;
      uVar14 = (ulong)(int)uVar8;
      if (this->verbose < 6) {
        pvVar15 = (local_38->occs).data + uVar14;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"c [DRAT-OTFC] propagate lit ",0x1c);
        uVar10 = ~((int)uVar8 >> 1);
        if ((uVar14 & 1) == 0) {
          uVar10 = ((int)uVar8 >> 1) + 1;
        }
        std::ostream::operator<<((ostream *)&std::cerr,uVar10);
        std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
        std::ostream::put('X');
        std::ostream::flush();
        pvVar15 = (this->watches).occs.data + uVar14;
        if (6 < this->verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"c [DRAT-OTFC] propagate with ",0x1d);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,pvVar15->sz);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," longer clauses",0xf);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
        }
      }
      pWVar19 = pvVar15->data;
      pWVar11 = pWVar19 + pvVar15->sz;
      if ((long)pvVar15->sz != 0) {
        uVar8 = uVar8 ^ 1;
        pWVar18 = pWVar19;
        local_40 = pWVar19 + pvVar15->sz;
        do {
          if (7 < this->verbose) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"c [DRAT-OTFC] propagate with clause ",0x24);
            puVar3 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
            if (0x3ffffffff < *(ulong *)(puVar3 + pWVar18->cref)) {
              puVar1 = (ulong *)(puVar3 + pWVar18->cref);
              uVar14 = 0;
              do {
                uVar10 = *(uint *)((long)puVar1 + uVar14 * 4 + 8);
                uVar16 = (int)uVar10 >> 1;
                uVar21 = ~uVar16;
                if ((uVar10 & 1) == 0) {
                  uVar21 = uVar16 + 1;
                }
                std::ostream::operator<<((ostream *)&std::cerr,uVar21);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
                uVar14 = uVar14 + 1;
              } while (uVar14 < *puVar1 >> 0x22);
            }
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
            std::ostream::put('X');
            std::ostream::flush();
          }
          uVar10 = (pWVar18->blocker).x;
          uVar21 = (int)uVar10 >> 1;
          plVar4 = (this->assigns).data;
          if (plVar4[(int)uVar21].value != ((byte)uVar10 & 1)) {
            uVar21 = pWVar18->cref;
            puVar3 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
            puVar1 = (ulong *)(puVar3 + uVar21);
            LVar20.x = (int)puVar1[1];
            if (LVar20.x == uVar8) {
              LVar20.x = *(int *)((long)puVar1 + 0xc);
              *(int *)(puVar1 + 1) = LVar20.x;
              *(uint *)((long)puVar1 + 0xc) = uVar8;
            }
            uVar16 = LVar20.x >> 1;
            local_48.cref = uVar21;
            local_48.blocker.x = LVar20.x;
            if ((LVar20.x != uVar10) && (plVar4[(int)uVar16].value == ((byte)LVar20.x & 1))) {
              if (8 < this->verbose) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"c [DRAT-OTFC] clause is true by other watch ",0x2c
                          );
                uVar10 = ~uVar16;
                if ((LVar20.x & 1U) == 0) {
                  uVar10 = uVar16 + 1;
                }
                std::ostream::operator<<((ostream *)&std::cerr,uVar10);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
                if (0x3ffffffff < *puVar1) {
                  uVar14 = 0;
                  do {
                    uVar10 = *(uint *)((long)puVar1 + uVar14 * 4 + 8);
                    uVar16 = (int)uVar10 >> 1;
                    uVar21 = ~uVar16;
                    if ((uVar10 & 1) == 0) {
                      uVar21 = uVar16 + 1;
                    }
                    std::ostream::operator<<((ostream *)&std::cerr,uVar21);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
                    uVar14 = uVar14 + 1;
                  } while (uVar14 < *puVar1 >> 0x22);
                }
                std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
                std::ostream::put('X');
                std::ostream::flush();
              }
              WVar5.blocker.x = local_48.blocker.x;
              WVar5.cref = local_48.cref;
              *pWVar19 = WVar5;
              pWVar19 = pWVar19 + 1;
              goto LAB_001233c2;
            }
            if (2 < (uint)(*puVar1 >> 0x22)) {
              lVar13 = 0;
LAB_00123143:
              uVar10 = puVar3[(ulong)uVar21 + lVar13 + 4];
              if (((byte)uVar10 & 1 ^ plVar4[(int)uVar10 >> 1].value) == 1) goto code_r0x00123162;
              if (8 < this->verbose) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"c [DRAT-OTFC] found new watch for the clause: ",
                           0x2e);
                uVar16 = (int)puVar3[(ulong)uVar21 + lVar13 + 4] >> 1;
                uVar10 = ~uVar16;
                if ((puVar3[(ulong)uVar21 + lVar13 + 4] & 1) == 0) {
                  uVar10 = uVar16 + 1;
                }
                std::ostream::operator<<((ostream *)&std::cerr,uVar10);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
                if (0x3ffffffff < *puVar1) {
                  uVar14 = 0;
                  do {
                    uVar10 = *(uint *)((long)puVar1 + uVar14 * 4 + 8);
                    uVar17 = (int)uVar10 >> 1;
                    uVar16 = ~uVar17;
                    if ((uVar10 & 1) == 0) {
                      uVar16 = uVar17 + 1;
                    }
                    std::ostream::operator<<((ostream *)&std::cerr,uVar16);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
                    uVar14 = uVar14 + 1;
                  } while (uVar14 < *puVar1 >> 0x22);
                }
                std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
                std::ostream::put('X');
                std::ostream::flush();
                uVar10 = puVar3[(ulong)uVar21 + lVar13 + 4];
              }
              *(uint *)((long)puVar1 + 0xc) = uVar10;
              puVar3[(ulong)uVar21 + lVar13 + 4] = uVar8;
              vec<Minisat::Watcher>::push
                        ((local_38->occs).data + ((long)*(int *)((long)puVar1 + 0xc) ^ 1),&local_48)
              ;
              goto LAB_001233c2;
            }
LAB_0012316a:
            WVar6.blocker.x = LVar20.x;
            WVar6.cref = uVar21;
            *pWVar19 = WVar6;
            pWVar19 = pWVar19 + 1;
            if (((byte)LVar20.x & 1 ^ (this->assigns).data[(int)uVar16].value) != 1) {
              if (8 < this->verbose) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"c [DRAT-OTFC] enqueue ",0x16);
                uVar10 = ~uVar16;
                if ((LVar20.x & 1U) == 0) {
                  uVar10 = uVar16 + 1;
                }
                std::ostream::operator<<((ostream *)&std::cerr,uVar10);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr," with reason ",0xd);
                puVar3 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
                if (0x3ffffffff < *(ulong *)(puVar3 + uVar21)) {
                  puVar1 = (ulong *)(puVar3 + uVar21);
                  uVar14 = 0;
                  do {
                    uVar10 = *(uint *)((long)puVar1 + uVar14 * 4 + 8);
                    uVar16 = (int)uVar10 >> 1;
                    uVar21 = ~uVar16;
                    if ((uVar10 & 1) == 0) {
                      uVar21 = uVar16 + 1;
                    }
                    std::ostream::operator<<((ostream *)&std::cerr,uVar21);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
                    uVar14 = uVar14 + 1;
                  } while (uVar14 < *puVar1 >> 0x22);
                }
                std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
                std::ostream::put('X');
                std::ostream::flush();
              }
              uncheckedEnqueue(this,LVar20);
              goto LAB_001233c2;
            }
            this->qhead = (this->trail).sz;
            while (pWVar18 = pWVar18 + 1, pWVar11 = pWVar18, local_5c = uVar21, pWVar18 < local_40)
            {
              *pWVar19 = *pWVar18;
              pWVar19 = pWVar19 + 1;
            }
            break;
          }
          if (8 < this->verbose) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"c [DRAT-OTFC] clause is true by blocker ",0x28);
            uVar16 = ~uVar21;
            if ((uVar10 & 1) == 0) {
              uVar16 = uVar21 + 1;
            }
            std::ostream::operator<<((ostream *)&std::cerr,uVar16);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
            puVar3 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
            if (0x3ffffffff < *(ulong *)(puVar3 + pWVar18->cref)) {
              puVar1 = (ulong *)(puVar3 + pWVar18->cref);
              uVar14 = 0;
              do {
                uVar10 = *(uint *)((long)puVar1 + uVar14 * 4 + 8);
                uVar16 = (int)uVar10 >> 1;
                uVar21 = ~uVar16;
                if ((uVar10 & 1) == 0) {
                  uVar21 = uVar16 + 1;
                }
                std::ostream::operator<<((ostream *)&std::cerr,uVar21);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
                uVar14 = uVar14 + 1;
              } while (uVar14 < *puVar1 >> 0x22);
            }
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
            std::ostream::put('X');
            std::ostream::flush();
          }
          *pWVar19 = *pWVar18;
          pWVar19 = pWVar19 + 1;
LAB_001233c2:
          pWVar18 = pWVar18 + 1;
          pWVar11 = local_40;
        } while (pWVar18 != local_40);
      }
      pvVar15->sz = pvVar15->sz - (int)((ulong)((long)pWVar11 - (long)pWVar19) >> 3);
      iVar7 = this->qhead;
    } while (iVar7 < (this->trail).sz);
    bVar22 = local_5c != 0xffffffff;
  }
  else {
    bVar22 = false;
  }
  if (5 < this->verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"c [DRAT-OTFC] propagate returns ",0x20);
    poVar9 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  return bVar22;
code_r0x00123162:
  lVar13 = lVar13 + 1;
  if ((*puVar1 >> 0x22) - 2 == lVar13) goto LAB_0012316a;
  goto LAB_00123143;
}

Assistant:

inline bool OnlineProofChecker::propagate()
{
    CRef confl = CRef_Undef;
    int num_props = 0;
    watches.cleanAll();

    DOUT(if (verbose > 3) std::cerr << "c [DRAT-OTFC] propagate ... " << std::endl;);

    // propagate units first!
    DOUT(if (verbose > 4) std::cerr << "c [DRAT-OTFC] propagate " << unitClauses.size() << " units" << std::endl;);
    for (int i = 0; i < unitClauses.size(); ++i) { // propagate all known units
        const Lit l = unitClauses[i];
        if (value(l) == l_True) {
            continue;
        } else if (value(l) == l_False) {
            return true;
        } else {
            uncheckedEnqueue(l);
        }
    }


    while (qhead < trail.size()) {
        Lit p = trail[qhead++]; // 'p' is enqueued fact to propagate.
        num_props++;
        DOUT(if (verbose > 5) std::cerr << "c [DRAT-OTFC] propagate lit " << p << std::endl;);

        vec<Watcher> &ws = watches[p];
        DOUT(if (verbose > 6) std::cerr << "c [DRAT-OTFC] propagate with " << ws.size() << " longer clauses" << std::endl;);
        Watcher *i, *j, *end;
        // propagate longer clauses here!
        for (i = j = (Watcher *)ws, end = i + ws.size(); i != end;) {
            DOUT(if (verbose > 7) std::cerr << "c [DRAT-OTFC] propagate with clause " << ca[i->cref] << std::endl;);

            // Try to avoid inspecting the clause:
            const Lit blocker = i->blocker;
            if (value(blocker) == l_True) { // keep binary clauses, and clauses where the blocking literal is satisfied
                DOUT(if (verbose > 8) std::cerr << "c [DRAT-OTFC] clause is true by blocker " << blocker << " in "
                                                << ca[i->cref] << std::endl;);
                *j++ = *i++;
                continue;
            }

            // Make sure the false literal is data[1]:
            const CRef cr = i->cref;
            Clause &c = ca[cr];
            const Lit false_lit = ~p;
            if (c[0] == false_lit) {
                c[0] = c[1], c[1] = false_lit;
            }
            assert(c[1] == false_lit && "wrong literal order in the clause!");
            i++;

            // If 0th watch is true, then clause is already satisfied.
            Lit first = c[0];
            const Watcher &w = Watcher(cr, first);            // updates the blocking literal
            if (first != blocker && value(first) == l_True) { // satisfied clause
                DOUT(if (verbose > 8) std::cerr << "c [DRAT-OTFC] clause is true by other watch " << first << " in "
                                                << c << std::endl;);
                *j++ = w;
                continue;
            } // same as goto NextClause;

            // Look for new watch:
            for (int k = 2; k < c.size(); k++)
                if (value(c[k]) != l_False) {
                    DOUT(if (verbose > 8) std::cerr << "c [DRAT-OTFC] found new watch for the clause: " << c[k]
                                                    << " in " << c << std::endl;);
                    c[1] = c[k];
                    c[k] = false_lit;
                    watches[~c[1]].push(w);
                    goto NextClause;
                } // no need to indicate failure of lhbr, because remaining code is skipped in this case!

            // Did not find watch -- clause is unit under assignment:
            *j++ = w;
            if (value(first) == l_False) {
                confl = cr;
                qhead = trail.size();
                // Copy the remaining watches:
                while (i < end) {
                    *j++ = *i++;
                }
                break;
            } else {
                DOUT(if (verbose > 8) std::cerr << "c [DRAT-OTFC] enqueue " << first << " with reason " << ca[cr] << std::endl;);
                uncheckedEnqueue(first);
            }
        NextClause:;
        }
        ws.shrink_(i - j); // remove all duplciate clauses!
    }
    DOUT(if (verbose > 5) std::cerr << "c [DRAT-OTFC] propagate returns " << (confl != CRef_Undef) << std::endl;);
    return (confl != CRef_Undef); // return true, if something was found!
}